

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface_linux.cpp
# Opt level: O0

QString * QNetworkInterfaceManager::interfaceNameFromIndex(uint index)

{
  int iVar1;
  int iVar2;
  undefined4 in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int socket;
  ifreq req;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int fd;
  QString *data;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  iVar1 = qt_safe_socket((int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffff9c,
                         in_stack_ffffffffffffff98);
  if (-1 < iVar1) {
    memset(local_30,0xaa,0x28);
    iVar2 = qt_safe_ioctl<ifreq*>
                      ((int)((ulong)in_RDI >> 0x20),
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (ifreq *)0x35d926);
    fd = (int)((ulong)in_RDI >> 0x20);
    if (-1 < iVar2) {
      qt_safe_close(fd);
      QByteArrayView::QByteArrayView<16ul>
                ((QByteArrayView *)CONCAT44(in_ESI,iVar1),(char (*) [16])data);
      QString::fromLatin1((QByteArrayView *)in_RDI);
      goto LAB_0035d96c;
    }
    qt_safe_close(fd);
  }
  QString::QString((QString *)0x35d96c);
LAB_0035d96c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return data;
  }
  __stack_chk_fail();
}

Assistant:

QString QNetworkInterfaceManager::interfaceNameFromIndex(uint index)
{
    int socket = qt_safe_socket(AF_INET, SOCK_DGRAM, 0);
    if (socket >= 0) {
        struct ifreq req;
        req.ifr_ifindex = index;

        if (qt_safe_ioctl(socket, SIOCGIFNAME, &req) >= 0) {
            qt_safe_close(socket);
            return QString::fromLatin1(req.ifr_name);
        }
        qt_safe_close(socket);
    }
    return QString();
}